

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_dependent_join.cpp
# Opt level: O0

void duckdb::CreateDelimJoinConditions
               (LogicalComparisonJoin *delim_join,
               vector<duckdb::CorrelatedColumnInfo,_true> *correlated_columns,
               vector<duckdb::ColumnBinding,_true> *bindings,idx_t base_offset,bool perform_delim)

{
  ulong uVar1;
  size_type sVar2;
  undefined8 uVar3;
  long in_RCX;
  vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *in_RDX;
  vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_> *in_RSI;
  byte in_R8B;
  JoinCondition cond;
  idx_t binding_idx;
  value_type *col;
  idx_t i;
  size_type col_count;
  string *in_stack_fffffffffffffee8;
  JoinCondition *in_stack_fffffffffffffef0;
  size_type local_c8;
  ColumnBinding *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  allocator local_69;
  string local_68 [32];
  ulong local_48;
  const_reference local_40;
  ulong local_38;
  size_type local_30;
  byte local_21;
  long local_20;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  if (local_21 == 0) {
    local_c8 = 1;
  }
  else {
    local_c8 = ::std::
               vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>::
               size(in_RSI);
  }
  local_30 = local_c8;
  local_38 = 0;
  while( true ) {
    if (local_30 <= local_38) {
      return;
    }
    local_40 = vector<duckdb::CorrelatedColumnInfo,_true>::operator[]
                         ((vector<duckdb::CorrelatedColumnInfo,_true> *)in_stack_fffffffffffffef0,
                          (size_type)in_stack_fffffffffffffee8);
    uVar1 = local_20 + local_38;
    local_48 = uVar1;
    sVar2 = ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::size
                      (in_RDX);
    if (sVar2 <= uVar1) break;
    JoinCondition::JoinCondition(in_stack_fffffffffffffef0);
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string_const&,duckdb::LogicalType_const&,duckdb::ColumnBinding_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff68,(LogicalType *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
    unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
    unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
              (&in_stack_fffffffffffffef0->left,
               (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
                *)in_stack_fffffffffffffee8);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
              (&in_stack_fffffffffffffef0->left,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffee8);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               0x19f9bbe);
    unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
    ::~unique_ptr((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                   *)0x19f9bc8);
    vector<duckdb::ColumnBinding,_true>::operator[]
              ((vector<duckdb::ColumnBinding,_true> *)in_stack_fffffffffffffef0,
               (size_type)in_stack_fffffffffffffee8);
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string_const&,duckdb::LogicalType_const&,duckdb::ColumnBinding&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff68,(LogicalType *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
    in_stack_fffffffffffffee8 = (string *)&stack0xffffffffffffff50;
    in_stack_fffffffffffffef0 = (JoinCondition *)&stack0xffffffffffffff48;
    unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
    unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffef0,
               (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
                *)in_stack_fffffffffffffee8);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
              (&in_stack_fffffffffffffef0->left,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffee8);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               0x19f9c4b);
    unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
    ::~unique_ptr((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                   *)0x19f9c55);
    ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::push_back
              ((vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> *)
               in_stack_fffffffffffffef0,(value_type *)in_stack_fffffffffffffee8);
    JoinCondition::~JoinCondition(in_stack_fffffffffffffef0);
    local_38 = local_38 + 1;
  }
  uVar3 = __cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_68,"Delim join - binding index out of range",&local_69);
  InternalException::InternalException
            ((InternalException *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  __cxa_throw(uVar3,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

static void CreateDelimJoinConditions(LogicalComparisonJoin &delim_join,
                                      const vector<CorrelatedColumnInfo> &correlated_columns,
                                      vector<ColumnBinding> bindings, idx_t base_offset, bool perform_delim) {
	auto col_count = perform_delim ? correlated_columns.size() : 1;
	for (idx_t i = 0; i < col_count; i++) {
		auto &col = correlated_columns[i];
		auto binding_idx = base_offset + i;
		if (binding_idx >= bindings.size()) {
			throw InternalException("Delim join - binding index out of range");
		}
		JoinCondition cond;
		cond.left = make_uniq<BoundColumnRefExpression>(col.name, col.type, col.binding);
		cond.right = make_uniq<BoundColumnRefExpression>(col.name, col.type, bindings[binding_idx]);
		cond.comparison = ExpressionType::COMPARE_NOT_DISTINCT_FROM;
		delim_join.conditions.push_back(std::move(cond));
	}
}